

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManPrintObjects(Gli_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int k;
  int i;
  Gli_Obj_t *pNext;
  Gli_Obj_t *pObj;
  Gli_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < p->nObjData) {
      pNext = Gli_ManObj(p,local_24);
      bVar2 = pNext != (Gli_Obj_t *)0x0;
    }
    if (!bVar2) break;
    printf("Node %d \n",(ulong)pNext->Handle);
    printf("Fanins: ");
    local_28 = 0;
    while( true ) {
      bVar2 = false;
      if (local_28 < (int)(*(uint *)pNext >> 4 & 7)) {
        _k = Gli_ObjFanin(pNext,local_28);
        bVar2 = _k != (Gli_Obj_t *)0x0;
      }
      if (!bVar2) break;
      printf("%d ",(ulong)_k->Handle);
      local_28 = local_28 + 1;
    }
    printf("\n");
    printf("Fanouts: ");
    local_28 = 0;
    while( true ) {
      bVar2 = false;
      if (local_28 < (int)(*(uint *)pNext >> 7)) {
        _k = Gli_ObjFanout(pNext,local_28);
        bVar2 = _k != (Gli_Obj_t *)0x0;
      }
      if (!bVar2) break;
      printf("%d ",(ulong)_k->Handle);
      local_28 = local_28 + 1;
    }
    printf("\n");
    iVar1 = Gli_ObjSize(pNext);
    local_24 = iVar1 + local_24;
  }
  return;
}

Assistant:

void Gli_ManPrintObjects( Gli_Man_t * p )
{
    Gli_Obj_t * pObj, * pNext;
    int i, k;
    Gli_ManForEachObj( p, pObj, i )
    {
        printf( "Node %d \n", pObj->Handle );
        printf( "Fanins: " );
        Gli_ObjForEachFanin( pObj, pNext, k )
            printf( "%d ", pNext->Handle );
        printf( "\n" );
        printf( "Fanouts: " );
        Gli_ObjForEachFanout( pObj, pNext, k )
            printf( "%d ", pNext->Handle );
        printf( "\n" );
    }
}